

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTetrahedronFace.h
# Opt level: O1

void __thiscall
chrono::fea::ChTetrahedronFace::LoadableGetStateBlock_w
          (ChTetrahedronFace *this,int block_offset,ChStateDelta *mD)

{
  double *pdVar1;
  Index index;
  ulong uVar2;
  ulong uVar3;
  int i;
  ulong uVar4;
  ChLoadableUV local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  
  uVar3 = (ulong)(uint)block_offset;
  i = (int)this;
  GetNodeN((ChTetrahedronFace *)&local_30,i);
  if ((-1 < block_offset) &&
     ((long)block_offset <=
      (mD->super_ChVectorDynamic<double>).
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + -3)) {
    pdVar1 = (mD->super_ChVectorDynamic<double>).
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
             block_offset;
    uVar2 = 3;
    if ((((ulong)pdVar1 & 7) == 0) &&
       (uVar4 = (ulong)(-((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7), uVar4 < 3)) {
      uVar2 = uVar4;
    }
    if (uVar2 != 0) {
      uVar4 = 0;
      do {
        pdVar1[uVar4] = *(double *)((long)local_30 + 0x38 + uVar4 * 8);
        uVar4 = uVar4 + 1;
      } while (uVar2 != uVar4);
    }
    if (uVar2 < 3) {
      do {
        pdVar1[uVar2] = *(double *)((long)local_30 + 0x38 + uVar2 * 8);
        uVar2 = uVar2 + 1;
      } while (uVar2 != 3);
    }
    if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
    }
    GetNodeN((ChTetrahedronFace *)&local_30,i);
    if ((long)(uVar3 + 3) <=
        (mD->super_ChVectorDynamic<double>).
        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + -3) {
      pdVar1 = (mD->super_ChVectorDynamic<double>).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
               uVar3 + 3;
      uVar2 = 3;
      if ((((ulong)pdVar1 & 7) == 0) &&
         (uVar4 = (ulong)(-((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7), uVar4 < 3)) {
        uVar2 = uVar4;
      }
      if (uVar2 != 0) {
        uVar4 = 0;
        do {
          pdVar1[uVar4] = *(double *)((long)local_30 + 0x38 + uVar4 * 8);
          uVar4 = uVar4 + 1;
        } while (uVar2 != uVar4);
      }
      if (uVar2 < 3) {
        do {
          pdVar1[uVar2] = *(double *)((long)local_30 + 0x38 + uVar2 * 8);
          uVar2 = uVar2 + 1;
        } while (uVar2 != 3);
      }
      if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
      }
      GetNodeN((ChTetrahedronFace *)&local_30,i);
      if ((long)(uVar3 + 6) <=
          (mD->super_ChVectorDynamic<double>).
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + -3) {
        pdVar1 = (mD->super_ChVectorDynamic<double>).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
                 uVar3 + 6;
        uVar3 = 3;
        if ((((ulong)pdVar1 & 7) == 0) &&
           (uVar2 = (ulong)(-((uint)((ulong)pdVar1 >> 3) & 0x1fffffff) & 7), uVar2 < 3)) {
          uVar3 = uVar2;
        }
        if (uVar3 != 0) {
          uVar2 = 0;
          do {
            pdVar1[uVar2] = *(double *)((long)local_30 + 0x38 + uVar2 * 8);
            uVar2 = uVar2 + 1;
          } while (uVar3 != uVar2);
        }
        if (uVar3 < 3) {
          do {
            pdVar1[uVar3] = *(double *)((long)local_30 + 0x38 + uVar3 * 8);
            uVar3 = uVar3 + 1;
          } while (uVar3 != 3);
        }
        if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
        }
        return;
      }
    }
  }
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

virtual void LoadableGetStateBlock_w(int block_offset, ChStateDelta& mD) override {
        mD.segment(block_offset + 0, 3) = GetNodeN(0)->GetPos_dt().eigen();
        mD.segment(block_offset + 3, 3) = GetNodeN(1)->GetPos_dt().eigen();
        mD.segment(block_offset + 6, 3) = GetNodeN(2)->GetPos_dt().eigen();
    }